

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O2

double __thiscall HighsPseudocost::getScore(HighsPseudocost *this,HighsInt col,double frac)

{
  double dVar1;
  double downcost;
  
  dVar1 = getPseudocostUp(this,col,frac);
  downcost = getPseudocostDown(this,col,frac);
  dVar1 = getScore(this,col,dVar1,downcost);
  return dVar1;
}

Assistant:

double getScore(HighsInt col, double frac) const {
    double upcost = getPseudocostUp(col, frac);
    double downcost = getPseudocostDown(col, frac);

    return getScore(col, upcost, downcost);
  }